

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_36::HttpFixedLengthEntityWriter::write
          (HttpFixedLengthEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  Coroutine<void> *this_00;
  ulong *puVar1;
  HttpOutputStream *this_01;
  PromiseAwaiter<void> *__return_storage_ptr__;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  PromiseArenaMember *node;
  SourceLocation location;
  bool bVar4;
  coroutine_handle<void> coroutine;
  HttpOutputStream *pHVar5;
  long lVar6;
  int iVar7;
  undefined4 in_register_00000034;
  HttpEntityBodyWriter *this_02;
  ulong uVar8;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  Fault f;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  Fault local_68;
  DebugComparison<unsigned_long_&,_unsigned_long_&> local_60;
  ExceptionOrValue *local_38;
  
  this_02 = (HttpEntityBodyWriter *)CONCAT44(in_register_00000034,__fd);
  coroutine._M_fr_ptr = operator_new(0x410);
  *(code **)coroutine._M_fr_ptr = write;
  *(code **)((long)coroutine._M_fr_ptr + 8) = write;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(HttpEntityBodyWriter **)((long)coroutine._M_fr_ptr + 0x400) = this_02;
  local_60.left = (unsigned_long *)0x5af2e6;
  local_60.right = (unsigned_long *)0x57dace;
  local_60.op.content.ptr = (char *)0x11000009b1;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006e78f0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006e7938;
  local_38 = (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98);
  location.function = "write";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x9b1;
  location.columnNumber = 0x11;
  kj::_::CoroutineBase::CoroutineBase((CoroutineBase *)this_00,coroutine,local_38,location);
  puVar1 = (ulong *)((long)coroutine._M_fr_ptr + 0x3f0);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006e78f0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006e7938;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpEntityBodyWriter).super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)this_00;
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x3f0) = 0;
  if (__n != 0) {
    lVar6 = 0;
    uVar8 = 0;
    do {
      uVar8 = uVar8 + *(long *)((long)__buf + lVar6 + 8);
      lVar6 = lVar6 + 0x10;
    } while (__n << 4 != lVar6);
    *puVar1 = uVar8;
  }
  pp_Var2 = (_func_int **)*puVar1;
  if (pp_Var2 == (_func_int **)0x0) {
    iVar7 = 3;
    kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x40a));
  }
  else {
    local_60.right = (unsigned_long *)(this_02 + 1);
    pp_Var3 = this_02[1].super_AsyncOutputStream._vptr_AsyncOutputStream;
    local_60.op.content.ptr = " <= ";
    local_60.op.content.size_ = 5;
    local_60.result = pp_Var3 >= pp_Var2;
    local_60.left = puVar1;
    if (pp_Var3 < pp_Var2) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[25]>
                (&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x9b6,FAILED,"size <= length","_kjCondition,\"overwrote Content-Length\"",
                 &local_60,(char (*) [25])"overwrote Content-Length");
      kj::_::Debug::Fault::fatal(&local_68);
    }
    this_02[1].super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)((long)pp_Var3 - (long)pp_Var2);
    pHVar5 = HttpEntityBodyWriter::getInner(this_02);
    this_01 = (HttpOutputStream *)((long)coroutine._M_fr_ptr + 0x3f8);
    pieces.size_ = (size_t)__buf;
    pieces.ptr = (ArrayPtr<const_unsigned_char> *)pHVar5;
    HttpOutputStream::writeBodyData(this_01,pieces);
    __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
    co_await<void>(__return_storage_ptr__,(Promise<void> *)this_01);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x408) = 0;
    bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar4) {
      return (ssize_t)this;
    }
    kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    node = (PromiseArenaMember *)
           (this_01->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
           currentWrapper.ptr;
    if (node != (PromiseArenaMember *)0x0) {
      (this_01->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
      currentWrapper.ptr = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
      kj::_::PromiseDisposer::dispose(node);
    }
    iVar7 = 0;
    if ((*(HttpEntityBodyWriter **)((long)coroutine._M_fr_ptr + 0x400))[1].super_AsyncOutputStream.
        _vptr_AsyncOutputStream == (_func_int **)0x0) {
      HttpEntityBodyWriter::doneWriting
                (*(HttpEntityBodyWriter **)((long)coroutine._M_fr_ptr + 0x400));
    }
  }
  if (iVar7 != 3) {
    if (iVar7 != 0) {
      if ((local_38->exception).ptr.isSet == true) {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
      }
      kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
      operator_delete(coroutine._M_fr_ptr,0x410);
      return (ssize_t)this;
    }
    kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x409));
  }
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x408) = 1;
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    uint64_t size = 0;
    for (auto& piece: pieces) size += piece.size();

    if (size == 0) co_return;
    KJ_REQUIRE(size <= length, "overwrote Content-Length");
    length -= size;

    co_await getInner().writeBodyData(pieces);
    if (length == 0) doneWriting();
  }